

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

void __thiscall
sentencepiece::SelfTestData_Sample::InternalSwap
          (SelfTestData_Sample *this,SelfTestData_Sample *other)

{
  InternalMetadata *this_00;
  InternalMetadata *this_01;
  uint32 uVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  void *pvVar4;
  
  this_00 = &(other->super_MessageLite)._internal_metadata_;
  if ((((ulong)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) != 0) ||
     (((ulong)this_00->ptr_ & 1) != 0)) {
    this_01 = &(this->super_MessageLite)._internal_metadata_;
    if (((ulong)this_00->ptr_ & 1) == 0) {
      google::protobuf::internal::InternalMetadata::
      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    pvVar4 = this_01->ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      pbVar3 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_01);
    }
    else {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::swap((string *)pbVar3);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    pvVar4 = *(void **)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  if (((undefined8 *)(this->input_).tagged_ptr_.ptr_ !=
       &google::protobuf::internal::fixed_address_empty_string) ||
     ((undefined8 *)(other->input_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string)) {
    psVar2 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&this->input_,pvVar4);
    google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&other->input_,pvVar4);
    std::__cxx11::string::swap((string *)psVar2);
  }
  pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    pvVar4 = *(void **)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  if (((undefined8 *)(this->expected_).tagged_ptr_.ptr_ ==
       &google::protobuf::internal::fixed_address_empty_string) &&
     ((undefined8 *)(other->expected_).tagged_ptr_.ptr_ ==
      &google::protobuf::internal::fixed_address_empty_string)) {
    return;
  }
  psVar2 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&this->expected_,pvVar4);
  google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&other->expected_,pvVar4);
  std::__cxx11::string::swap((string *)psVar2);
  return;
}

Assistant:

void SelfTestData_Sample::InternalSwap(SelfTestData_Sample* other) {
  using std::swap;
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  input_.Swap(&other->input_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  expected_.Swap(&other->expected_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
}